

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FederateExport.cpp
# Opt level: O0

void helicsFederateUnProtect(char *fedName,HelicsError *err)

{
  string_view fedName_00;
  bool bVar1;
  element_type *this;
  FedObject *pFVar2;
  int *in_RSI;
  MasterObjectHolder *in_RDI;
  undefined1 in_stack_00000000 [12];
  int in_stack_0000000c;
  MasterObjectHolder *in_stack_00000010;
  string_view in_stack_00000018;
  bool result;
  char *in_stack_ffffffffffffff68;
  char *__str;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffff70;
  char local_58 [71];
  undefined1 local_11;
  int *local_10;
  
  local_10 = in_RSI;
  getMasterHolder();
  std::__shared_ptr_access<MasterObjectHolder,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<MasterObjectHolder,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x1bb0a3);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  bVar1 = MasterObjectHolder::removeFed(in_stack_00000010,in_stack_00000018,in_stack_0000000c);
  std::shared_ptr<MasterObjectHolder>::~shared_ptr((shared_ptr<MasterObjectHolder> *)0x1bb0e6);
  if (!bVar1) {
    __str = local_58;
    local_11 = bVar1;
    getMasterHolder();
    this = std::__shared_ptr_access<MasterObjectHolder,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<MasterObjectHolder,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x1bb11a);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)this,__str);
    fedName_00._M_str._4_4_ = in_stack_0000000c;
    fedName_00._0_12_ = in_stack_00000000;
    pFVar2 = MasterObjectHolder::findFed(in_RDI,fedName_00);
    std::shared_ptr<MasterObjectHolder>::~shared_ptr((shared_ptr<MasterObjectHolder> *)0x1bb168);
    if (((pFVar2 == (FedObject *)0x0) && (local_10 != (int *)0x0)) && (*local_10 == 0)) {
      *local_10 = -3;
      *(char **)(local_10 + 2) = "Federate was not found";
    }
  }
  return;
}

Assistant:

void helicsFederateUnProtect(const char* fedName, HelicsError* err)
{
    const bool result = getMasterHolder()->removeFed(fedName, fedPreservationIdentifier);
    if (!result) {
        if (!(getMasterHolder()->findFed(fedName) != nullptr)) {
            if (err != nullptr) {
                if (err->error_code == 0) {
                    err->error_code = HELICS_ERROR_INVALID_OBJECT;
                    err->message = unrecognizedFederate;
                }
            }
        }
    }
}